

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.h
# Opt level: O3

void __thiscall
kj::
CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++:896:52),_kj::(anonymous_namespace)::SocketAddress::LookupParams>
::~CaptureByMove(CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_unix_c__:896:52),_kj::(anonymous_namespace)::SocketAddress::LookupParams>
                 *this)

{
  char *pcVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  
  pcVar1 = (this->param).service.content.ptr;
  if (pcVar1 != (char *)0x0) {
    sVar2 = (this->param).service.content.size_;
    (this->param).service.content.ptr = (char *)0x0;
    (this->param).service.content.size_ = 0;
    pAVar3 = (this->param).service.content.disposer;
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pcVar1,1,sVar2,sVar2,0);
  }
  pcVar1 = (this->param).host.content.ptr;
  if (pcVar1 != (char *)0x0) {
    sVar2 = (this->param).host.content.size_;
    (this->param).host.content.ptr = (char *)0x0;
    (this->param).host.content.size_ = 0;
    pAVar3 = (this->param).host.content.disposer;
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pcVar1,1,sVar2,sVar2,0);
  }
  return;
}

Assistant:

inline CaptureByMove(Func&& func, MovedParam&& param)
      : func(kj::mv(func)), param(kj::mv(param)) {}